

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.cc
# Opt level: O1

bool testing::Mock::VerifyAndClear(void *mock_obj)

{
  bool bVar1;
  
  internal::MutexBase::Lock((MutexBase *)internal::g_gmock_mutex);
  ClearDefaultActionsLocked((void *)0x110afa);
  bVar1 = VerifyAndClearExpectationsLocked((void *)0x110b02);
  internal::MutexBase::Unlock((MutexBase *)internal::g_gmock_mutex);
  return bVar1;
}

Assistant:

GTEST_LOCK_EXCLUDED_(internal::g_gmock_mutex) {
  internal::MutexLock l(&internal::g_gmock_mutex);
  ClearDefaultActionsLocked(mock_obj);
  return VerifyAndClearExpectationsLocked(mock_obj);
}